

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O2

string * __thiscall
cpp_client::Connection::recieve_abi_cxx11_(string *__return_storage_ptr__,Connection *this)

{
  ostream *poVar1;
  
  Connection_internal::recieve_abi_cxx11_
            (__return_storage_ptr__,
             (this->conn_)._M_t.
             super___uniq_ptr_impl<cpp_client::Connection_internal,_std::default_delete<cpp_client::Connection_internal>_>
             ._M_t.
             super__Tuple_impl<0UL,_cpp_client::Connection_internal_*,_std::default_delete<cpp_client::Connection_internal>_>
             .super__Head_base<0UL,_cpp_client::Connection_internal_*,_false>._M_head_impl);
  if (this->print_communication_ == true) {
    poVar1 = ::operator<<((ostream *)&std::cout,text_magenta);
    poVar1 = std::operator<<(poVar1,"FROM SERVER <-- ");
    poVar1 = std::operator<<(poVar1,(string *)__return_storage_ptr__);
    poVar1 = ::operator<<(poVar1,normal);
    std::operator<<(poVar1,'\n');
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Connection::recieve()
{
   auto msg = conn_->recieve();
   if(print_communication_)
   {
      std::cout << sgr::text_magenta << "FROM SERVER <-- " << msg << sgr::reset << '\n';
   }
   return msg;
}